

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegexpExec(xmlRegexpPtr comp,xmlChar *content)

{
  xmlRegTrans *pxVar1;
  xmlRegAtomPtr pxVar2;
  void *pvVar3;
  xmlRegExecRollback *pxVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  xmlRegStatePtr pxVar11;
  bool bVar12;
  int len;
  xmlRegExecCtxt execval;
  int local_d4;
  xmlRegExecCtxt local_d0;
  xmlRegStatePtr local_38;
  
  if (content == (xmlChar *)0x0 || comp == (xmlRegexpPtr)0x0) {
    return -1;
  }
  local_d0.index = 0;
  local_d0.nbPush = 0;
  local_d0.status = 0;
  local_d0.determinist = 1;
  local_d0.maxRollbacks = 0;
  local_d0.nbRollbacks = 0;
  local_d0.rollbacks = (xmlRegExecRollback *)0x0;
  local_d0.state = *comp->states;
  local_d0.transno = 0;
  local_d0.transcount = 0;
  local_d0.inputStack = (xmlRegInputTokenPtr)0x0;
  local_d0.inputStackMax = 0;
  local_d0.comp = comp;
  local_d0.inputString = content;
  if ((long)comp->nbCounters < 1) {
    local_d0.counts = (int *)0x0;
  }
  else {
    local_d0.counts = (int *)(*xmlMalloc)((long)comp->nbCounters << 2);
    if (local_d0.counts == (int *)0x0) {
      xmlRegexpErrMemory((xmlRegParserCtxtPtr)0x0,"running regexp");
      return -1;
    }
    memset(local_d0.counts,0,(long)comp->nbCounters << 2);
  }
  do {
    if ((local_d0.state == (xmlRegStatePtr)0x0) ||
       ((local_d0.inputString[local_d0.index] == '\0' &&
        ((local_d0.state)->type == XML_REGEXP_FINAL_STATE)))) {
      iVar5 = 0;
      break;
    }
    local_d4 = 1;
    if ((local_d0.inputString[local_d0.index] == '\0') && (local_d0.counts == (int *)0x0)) {
      if (local_d0.transno < (local_d0.state)->nbTrans) {
        if (((local_d0.state)->trans[local_d0.transno].to < 0) ||
           ((pxVar2 = (local_d0.state)->trans[local_d0.transno].atom, pxVar2->min == 0 &&
            (0 < pxVar2->max)))) goto LAB_001a2168;
      }
LAB_001a24dd:
      local_d0._0_8_ = local_d0._0_8_ & 0xffffffff;
      xmlFARegExecRollBack(&local_d0);
    }
    else {
LAB_001a2168:
      local_d0.transcount = 0;
      pxVar11 = local_d0.state;
      iVar10 = local_d0.transno;
      if (local_d0.transno < (local_d0.state)->nbTrans) {
LAB_001a2179:
        iVar10 = local_d0.transno;
        pxVar11 = local_d0.state;
        if ((local_d0.state)->trans[local_d0.transno].to < 0) goto LAB_001a2414;
        pxVar1 = (local_d0.state)->trans + local_d0.transno;
        lVar8 = (long)pxVar1->count;
        if (-1 < lVar8) {
          if (local_d0.counts == (int *)0x0) {
LAB_001a2519:
            iVar5 = -1;
            break;
          }
          iVar5 = (local_d0.comp)->counters[lVar8].min;
          if ((local_d0.counts[lVar8] < iVar5) ||
             (iVar10 = (local_d0.comp)->counters[lVar8].max, iVar10 < local_d0.counts[lVar8]))
          goto LAB_001a2414;
          bVar12 = iVar5 != iVar10;
LAB_001a2395:
          if ((pxVar1->nd == 1) ||
             ((bVar12 && -1 < pxVar1->count && (local_d0.transno + 1 < (local_d0.state)->nbTrans))))
          {
            xmlFARegExecSave(&local_d0);
          }
          lVar8 = (long)pxVar1->counter;
          if (-1 < lVar8) {
            iVar5 = -1;
            if (((local_d0.counts == (int *)0x0) || (local_d0.comp == (xmlRegexpPtr)0x0)) ||
               ((local_d0.comp)->counters == (xmlRegCounter *)0x0)) break;
            if ((local_d0.comp)->counters[lVar8].max <= local_d0.counts[lVar8]) goto LAB_001a2414;
            local_d0.counts[lVar8] = local_d0.counts[lVar8] + 1;
          }
          if ((ulong)(uint)pxVar1->count < 0x123456) {
            if (local_d0.counts == (int *)0x0) goto LAB_001a2519;
            local_d0.counts[(uint)pxVar1->count] = 0;
          }
          local_d0.state = comp->states[pxVar1->to];
          local_d0.transno = 0;
          if (pxVar1->atom != (xmlRegAtomPtr)0x0) {
            local_d0.index = local_d0.index + local_d4;
          }
          goto LAB_001a24ef;
        }
        pxVar2 = pxVar1->atom;
        if (pxVar2 == (xmlRegAtomPtr)0x0) {
          xmlRegexpExec_cold_1();
          uVar7 = 0xfffffffe;
LAB_001a24d4:
          local_d0.status = uVar7;
          goto LAB_001a24d8;
        }
        if (local_d0.inputString[local_d0.index] == '\0') {
LAB_001a236b:
          if ((pxVar2->min == 0) && (0 < pxVar2->max)) {
            local_d0.transcount = 1;
            local_d4 = 0;
LAB_001a2393:
            bVar12 = false;
            goto LAB_001a2395;
          }
        }
        else {
          iVar5 = xmlStringCurrentChar
                            ((xmlParserCtxtPtr)0x0,local_d0.inputString + local_d0.index,&local_d4);
          iVar5 = xmlRegCheckCharacter(pxVar2,iVar5);
          if (iVar5 == 0) goto LAB_001a236b;
          if (iVar5 == 1) {
            if ((-1 < pxVar2->min) && (0 < pxVar2->max)) {
              local_38 = comp->states[pxVar1->to];
              uVar6 = pxVar1->counter;
              lVar8 = (long)(int)uVar6;
              if (-1 < lVar8) {
                iVar5 = -1;
                if (((local_d0.counts == (int *)0x0) || (local_d0.comp == (xmlRegexpPtr)0x0)) ||
                   ((local_d0.comp)->counters == (xmlRegCounter *)0x0)) break;
                if ((local_d0.comp)->counters[lVar8].max <= local_d0.counts[lVar8])
                goto LAB_001a2414;
              }
              if (iVar10 + 1 < pxVar11->nbTrans) {
                xmlFARegExecSave(&local_d0);
                uVar6 = pxVar1->counter;
              }
              if (-1 < (int)uVar6) {
                local_d0.counts[uVar6] = local_d0.counts[uVar6] + 1;
              }
              local_d0.transcount = 1;
              do {
                iVar5 = local_d0.transno;
                pxVar11 = local_d0.state;
                iVar10 = 1;
                if (local_d0.transcount == pxVar2->max) break;
                lVar8 = (long)local_d4 + (long)local_d0.index;
                if (local_d0.inputString[lVar8] == '\0') break;
                local_d0.index = (int)lVar8;
                if (pxVar2->min <= local_d0.transcount) {
                  local_d0.transno = -1;
                  local_d0.state = local_38;
                  xmlFARegExecSave(&local_d0);
                  lVar8 = (long)local_d0.index;
                }
                local_d0.state = pxVar11;
                local_d0.transno = iVar5;
                iVar5 = xmlStringCurrentChar
                                  ((xmlParserCtxtPtr)0x0,local_d0.inputString + lVar8,&local_d4);
                iVar10 = xmlRegCheckCharacter(pxVar2,iVar5);
                local_d0.transcount = local_d0.transcount + 1;
              } while (iVar10 == 1);
              if (local_d0.transcount < pxVar2->min) {
                iVar10 = 0;
              }
              if (0 < iVar10) {
                if (-1 < (long)pxVar1->counter) {
                  if (local_d0.counts == (int *)0x0) goto LAB_001a2519;
                  local_d0.counts[pxVar1->counter] = local_d0.counts[pxVar1->counter] + -1;
                }
                if (iVar10 != 1) goto LAB_001a2414;
                goto LAB_001a2393;
              }
              goto LAB_001a24dd;
            }
            goto LAB_001a2393;
          }
          if (iVar5 < 0) {
            uVar7 = 0xfffffffc;
            goto LAB_001a24d4;
          }
        }
LAB_001a2414:
        iVar10 = local_d0.transno + 1;
        pxVar11 = local_d0.state;
        local_d0.transno = iVar10;
        if ((local_d0.state)->nbTrans <= iVar10) goto LAB_001a24d8;
        goto LAB_001a2179;
      }
LAB_001a24d8:
      if ((iVar10 != 0) || (pxVar11->nbTrans == 0)) goto LAB_001a24dd;
    }
LAB_001a24ef:
    iVar5 = local_d0.status;
  } while (local_d0.status == 0);
  pxVar4 = local_d0.rollbacks;
  if (local_d0.rollbacks != (xmlRegExecRollback *)0x0) {
    if (0 < local_d0.maxRollbacks && local_d0.counts != (int *)0x0) {
      uVar9 = local_d0._48_8_ & 0xffffffff;
      lVar8 = 0;
      do {
        pvVar3 = *(void **)((long)&pxVar4->counts + lVar8);
        if (pvVar3 != (void *)0x0) {
          (*xmlFree)(pvVar3);
        }
        lVar8 = lVar8 + 0x18;
      } while (uVar9 * 0x18 != lVar8);
    }
    (*xmlFree)(pxVar4);
  }
  if (local_d0.state == (xmlRegStatePtr)0x0) {
    return -1;
  }
  if (local_d0.counts != (int *)0x0) {
    (*xmlFree)(local_d0.counts);
  }
  if (iVar5 == 0) {
    return 1;
  }
  if (iVar5 == -1) {
    return -(uint)(10000000 < local_d0.nbPush);
  }
  return iVar5;
}

Assistant:

int
xmlRegexpExec(xmlRegexpPtr comp, const xmlChar *content) {
    if ((comp == NULL) || (content == NULL))
	return(-1);
    return(xmlFARegExec(comp, content));
}